

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueMen.cpp
# Opt level: O0

void __thiscall BlueMen::BlueMen(BlueMen *this)

{
  Dice *pDVar1;
  BlueMen *this_local;
  
  Character::Character(&this->super_Character);
  (this->super_Character)._vptr_Character = (_func_int **)&PTR_RollAttack_0010fcb8;
  std::__cxx11::string::operator=((string *)&(this->super_Character).name,"BlueMen");
  (this->super_Character).alive = true;
  (this->super_Character).attackDieSides = 10;
  (this->super_Character).attackRolls = 2;
  (this->super_Character).defenceDieSides = 6;
  (this->super_Character).defenceRolls = 3;
  (this->super_Character).armor = 3;
  (this->super_Character).totalStrengthPoints = 0xc;
  (this->super_Character).currentStrengthPoints = (this->super_Character).totalStrengthPoints;
  pDVar1 = (Dice *)operator_new(0x10);
  Dice::Dice(pDVar1,(this->super_Character).attackDieSides);
  (this->super_Character).attackDie = pDVar1;
  pDVar1 = (Dice *)operator_new(0x10);
  Dice::Dice(pDVar1,(this->super_Character).defenceDieSides);
  (this->super_Character).defenseDie = pDVar1;
  return;
}

Assistant:

BlueMen::BlueMen()
{
    name = "BlueMen";

    alive = true;
    attackDieSides = 10;
    attackRolls = 2;
    defenceDieSides = 6;
    defenceRolls = 3;

    armor = 3;
    totalStrengthPoints = 12;
    currentStrengthPoints = totalStrengthPoints;

    attackDie = new Dice(attackDieSides);
    defenseDie = new Dice(defenceDieSides);
}